

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>
               (void)

{
  int iVar1;
  undefined1 auVar2 [8];
  Matrix_dimension_option MVar3;
  Column_settings *pCVar4;
  Index local_7cc;
  undefined8 local_7c8;
  undefined4 *local_7c0;
  undefined4 ****local_7b8;
  char *local_7b0;
  shared_count sStack_7a8;
  undefined8 *local_7a0;
  undefined4 local_794;
  undefined4 **local_790;
  char *local_788;
  undefined8 local_780;
  char *local_778;
  shared_count sStack_770;
  undefined **local_768;
  char *local_760;
  undefined8 *local_758;
  undefined4 **local_750;
  undefined4 ***local_748;
  ulong local_740;
  shared_count sStack_738;
  char *local_730;
  undefined1 local_728 [8];
  Underlying_matrix local_720;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  mb;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  mc1;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  mr;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  mc2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  m;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>>
            ();
  mc1.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc1.matrix_._4_4_ = 0;
  mc1.colSettings_ = (Column_settings *)birth_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mc2.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc2.matrix_._4_4_ = 0;
  mc2.colSettings_ = (Column_settings *)death_comp;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  pCVar4 = (Column_settings *)operator_new(0x38);
  (pCVar4->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (pCVar4->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.list.
  ptr = (char *)0x0;
  (pCVar4->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.list.
  sz = 0;
  (pCVar4->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  requested_size = 0x18;
  (pCVar4->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  next_size = 0x20;
  (pCVar4->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  start_size = 0x20;
  (pCVar4->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  max_size = 0;
  m.matrix_.super_Matrix_dimension_option.maxDim_ = -1;
  m.colSettings_ = pCVar4;
  std::function<bool_(unsigned_int,_unsigned_int)>::function
            ((function<bool_(unsigned_int,_unsigned_int)> *)&mb,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1);
  std::function<bool_(unsigned_int,_unsigned_int)>::function
            ((function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc2);
  m.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  m.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ = 0;
  m.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  m.matrix_.super_Chain_vine_swap_option.birthComp_._M_invoker =
       (_Invoker_type)
       mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_;
  if (mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    m.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
         CONCAT44(mb.matrix_._4_4_,mb.matrix_.super_Matrix_dimension_option.maxDim_);
    m.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
    _M_object = mb.colSettings_;
    m.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
         (_Manager_type)
         mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
         _M_unused._0_8_;
  }
  m.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  m.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_ = 0;
  m.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  m.matrix_.super_Chain_vine_swap_option.deathComp_._M_invoker =
       (_Invoker_type)
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_;
  if (mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    m.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._M_unused.
    _M_object = mr.colSettings_;
    m.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_ =
         mr.matrix_._0_8_;
    m.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
         (_Manager_type)
         mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
         _M_unused._0_8_;
  }
  m.matrix_.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  m.matrix_.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m.matrix_.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m.matrix_.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  m.matrix_.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  m.matrix_.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  m.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  m.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  m.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  m.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  m.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  m.matrix_.nextIndex_ = 0;
  m.matrix_.colSettings_ = pCVar4;
  if (mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mc2,&mc2,3);
  }
  if (mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mc1,&mc1,3);
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x15f);
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230e0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_7b8 = &local_748;
  local_748 = (undefined4 ***)CONCAT44(local_748._4_4_,m.matrix_.nextIndex_);
  local_768 = (undefined **)&local_780;
  mc2.colSettings_ = (Column_settings *)CONCAT71(mc2.colSettings_._1_7_,m.matrix_.nextIndex_ == 0);
  local_780 = (char *)((ulong)local_780._4_4_ << 0x20);
  mc2.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc2.matrix_._4_4_ = 0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_728 = (undefined1  [8])0x1e62cd;
  local_720._0_8_ = "";
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_7b8;
  mb.matrix_.super_Matrix_dimension_option.maxDim_ =
       mb.matrix_.super_Matrix_dimension_option.maxDim_ & 0xffffff00;
  mb.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00223050;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_768;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&mc2.matrix_.super_Chain_vine_swap_option);
  mr.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mr.matrix_._4_4_ = 0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mc1.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc1.matrix_._4_4_ = 0;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mb.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>
              *)&mb.matrix_,&ordered_boundaries,mb.colSettings_,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1);
  if (mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mc1,&mc1,3);
  }
  if (mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mr,&mr,3);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x163);
  mc2.matrix_._0_8_ = mc2.matrix_._0_8_ & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230e0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_748 = &local_790;
  local_790._0_4_ = 7;
  local_720.super_Matrix_dimension_option.maxDim_ = 0;
  local_720._4_4_ = 0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_7b8 = (undefined4 ****)0x1e62cd;
  local_7b0 = "";
  local_768 = (undefined **)&local_780;
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00223050;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_748;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_768;
  local_728[0] = mb.matrix_.nextIndex_ == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_720.super_Chain_vine_swap_option);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x164);
  mc2.matrix_._0_8_ = mc2.matrix_._0_8_ & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230e0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_780._0_4_ =
       mb.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_728[0] = (int)local_780 == 0;
  local_790._0_4_ = 0;
  local_720.super_Matrix_dimension_option.maxDim_ = 0;
  local_720._4_4_ = 0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_7b8 = (undefined4 ****)0x1e62cd;
  local_7b0 = "";
  local_768 = (undefined **)&local_780;
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_748 = &local_790;
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_748;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_768;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_720.super_Chain_vine_swap_option);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x165);
  mc2.matrix_._0_8_ = mc2.matrix_._0_8_ & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230e0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  iVar1 = mb.matrix_.matrix_.
          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_780 = (char *)CONCAT44(local_780._4_4_,iVar1);
  local_728[0] = iVar1 == 2;
  local_790 = (undefined4 **)CONCAT44(local_790._4_4_,2);
  local_720._0_8_ = 0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_7b8 = (undefined4 ****)0x1e62cd;
  local_7b0 = "";
  local_768 = (undefined **)&local_780;
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_748 = &local_790;
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_748;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_768;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_720.super_Chain_vine_swap_option);
  mc1.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc1.matrix_._4_4_ = 0;
  mc1.colSettings_ = (Column_settings *)birth_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mc2.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc2.matrix_._4_4_ = 0;
  mc2.colSettings_ = (Column_settings *)death_comp;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mr.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>
              *)&mr.matrix_,5,mr.colSettings_,(function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc2);
  if (mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mc2,&mc2,3);
  }
  if (mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_object != (void *)0x0) {
    (*mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
      _M_function_pointer)(&mc1,&mc1,3);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x169);
  local_720._0_8_ = local_720._0_8_ & 0xffffffffffffff00;
  local_728 = (undefined1  [8])&PTR__lazy_ostream_002230e0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_790 = (undefined4 **)CONCAT44(local_790._4_4_,mr.matrix_.nextIndex_);
  local_780 = (char *)&local_7c8;
  local_7b8 = (undefined4 ****)CONCAT71(local_7b8._1_7_,mr.matrix_.nextIndex_ == 0);
  local_7c8 = (Index *)((ulong)local_7c8._4_4_ << 0x20);
  local_7b0 = (char *)0x0;
  sStack_7a8.pi_ = (sp_counted_base *)0x0;
  local_768 = (undefined **)0x1e62cd;
  local_760 = "";
  local_748 = &local_790;
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00223050;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_748;
  mc2.matrix_._0_8_ = mc2.matrix_._0_8_ & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_002230a0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_780;
  boost::test_tools::tt_detail::report_assertion
            (&local_7b8,local_728,&local_768,0x169,1,2,2,"mr.get_number_of_columns()",&mc1,"0",&mc2)
  ;
  boost::detail::shared_count::~shared_count(&sStack_7a8);
  mc1.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
  ::Chain_matrix(&mc1.matrix_,&mb.matrix_,mc1.colSettings_);
  mc2.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
  ::Chain_matrix(&mc2.matrix_,&mb.matrix_,mc2.colSettings_);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x16e);
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230e0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = (undefined4 **)0x1e624b;
  local_790 = &local_7c0;
  local_7c8 = &local_7cc;
  local_7cc = 7;
  local_740 = 0;
  sStack_738.pi_ = (sp_counted_base *)0x0;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_778 = "";
  local_720._0_8_ = local_720._0_8_ & 0xffffffffffffff00;
  local_728 = (undefined1  [8])&PTR__lazy_ostream_00223050;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_790;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  local_748._0_1_ = mc1.matrix_.nextIndex_ == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_738);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x16f);
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230e0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = (undefined4 **)0x1e624b;
  local_7c0._0_4_ =
       mc1.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_748._0_1_ = (int)local_7c0 == 0;
  local_7cc = 0;
  local_740 = 0;
  sStack_738.pi_ = (sp_counted_base *)0x0;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_778 = "";
  local_790 = &local_7c0;
  local_720._0_8_ = local_720._0_8_ & 0xffffffffffffff00;
  local_728 = (undefined1  [8])&PTR__lazy_ostream_002230a0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_790;
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_738);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x170);
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230e0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = (undefined4 **)0x1e624b;
  local_7c0._0_4_ =
       mc1.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_748._0_1_ = (int)local_7c0 == 2;
  local_7cc = 2;
  local_740 = 0;
  sStack_738.pi_ = (sp_counted_base *)0x0;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_778 = "";
  local_790 = &local_7c0;
  local_720._0_8_ = local_720._0_8_ & 0xffffffffffffff00;
  local_728 = (undefined1  [8])&PTR__lazy_ostream_002230a0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_790;
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_738);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x171);
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230e0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = (undefined4 **)0x1e624b;
  local_748._0_1_ = mc2.matrix_.nextIndex_ == 7;
  local_7cc = 7;
  local_740 = 0;
  sStack_738.pi_ = (sp_counted_base *)0x0;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_778 = "";
  local_790 = &local_7c0;
  local_720._0_8_ = local_720._0_8_ & 0xffffffffffffff00;
  local_728 = (undefined1  [8])&PTR__lazy_ostream_00223050;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_790;
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_738);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x172);
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230e0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = (undefined4 **)0x1e624b;
  local_7c0._0_4_ =
       mc2.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_748._0_1_ = (int)local_7c0 == 0;
  local_7cc = 0;
  local_740 = 0;
  sStack_738.pi_ = (sp_counted_base *)0x0;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_778 = "";
  local_790 = &local_7c0;
  local_720._0_8_ = local_720._0_8_ & 0xffffffffffffff00;
  local_728 = (undefined1  [8])&PTR__lazy_ostream_002230a0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_790;
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_738);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x173);
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230e0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = (undefined4 **)0x1e624b;
  iVar1 = mc2.matrix_.matrix_.
          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_7c0 = (undefined4 *)CONCAT44(local_7c0._4_4_,iVar1);
  local_748 = (undefined4 ***)CONCAT71(local_748._1_7_,iVar1 == 2);
  local_7cc = 2;
  local_740 = 0;
  sStack_738.pi_ = (sp_counted_base *)0x0;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_778 = "";
  local_790 = &local_7c0;
  local_720._0_8_ = local_720._0_8_ & 0xffffffffffffff00;
  local_728 = (undefined1  [8])&PTR__lazy_ostream_002230a0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &local_790;
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_748,&local_768,&local_780,0x173,1,2,2,"mc2.get_column_dimension(6)",local_728,
             "2",&local_7b8);
  boost::detail::shared_count::~shared_count(&sStack_738);
  local_720.colSettings_ = mb.matrix_.colSettings_;
  local_720.nextIndex_ = mb.matrix_.nextIndex_;
  MVar3 = mb.matrix_.super_Matrix_dimension_option;
  local_728 = (undefined1  [8])mb.colSettings_;
  mb.colSettings_ = (Column_settings *)0x0;
  mb.matrix_.super_Matrix_dimension_option.maxDim_ = -1;
  local_720.super_Matrix_dimension_option.maxDim_ = MVar3.maxDim_;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ = 0;
  local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_720.super_Chain_vine_swap_option.birthComp_._M_invoker =
       mb.matrix_.super_Chain_vine_swap_option.birthComp_._M_invoker;
  if (mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
    _M_object = mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
                _M_unused._M_object;
    local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
         mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_;
    local_720.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
         mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager;
    mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
         (_Manager_type)0x0;
    mb.matrix_.super_Chain_vine_swap_option.birthComp_._M_invoker = (_Invoker_type)0x0;
  }
  local_720.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_720.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_ = 0;
  local_720.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_720.super_Chain_vine_swap_option.deathComp_._M_invoker =
       mb.matrix_.super_Chain_vine_swap_option.deathComp_._M_invoker;
  if (mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    local_720.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._M_unused.
    _M_object = mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor.
                _M_unused._M_object;
    local_720.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_ =
         mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_;
    local_720.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
         mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager;
    mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
         (_Manager_type)0x0;
    mb.matrix_.super_Chain_vine_swap_option.deathComp_._M_invoker = (_Invoker_type)0x0;
  }
  local_720.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_720.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_720.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_720.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_720.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_720.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_720.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       mb.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_720.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       mb.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_720.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       mb.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  mb.matrix_.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mb.matrix_.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mb.matrix_.matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_720.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ =
       mb.matrix_.pivotToColumnIndex_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_720.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ =
       mb.matrix_.pivotToColumnIndex_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_720.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ =
       mb.matrix_.pivotToColumnIndex_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_720.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ =
       mb.matrix_.pivotToColumnIndex_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_720.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       mb.matrix_.pivotToColumnIndex_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  mb.matrix_.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mb.matrix_.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mb.matrix_.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mb.matrix_.nextIndex_ = 0;
  mb.matrix_.colSettings_ = (Column_settings *)0x0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x177);
  local_740 = local_740 & 0xffffffffffffff00;
  local_748 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_738.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_730 = "";
  local_7cc = local_720.nextIndex_;
  local_794 = 7;
  local_778 = (char *)0x0;
  sStack_770.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined4 **)0x1e62cd;
  local_788 = "";
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_00223050;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230a0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = &local_7c0;
  local_7c0 = &local_794;
  local_780._0_1_ = local_720.nextIndex_ == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_770);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x178);
  local_740 = local_740 & 0xffffffffffffff00;
  local_748 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_738.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_730 = "";
  local_7cc = local_720.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_780._0_1_ = local_7cc == 0;
  local_794 = 0;
  local_778 = (char *)0x0;
  sStack_770.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined4 **)0x1e62cd;
  local_788 = "";
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230a0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = &local_7c0;
  local_7c0 = &local_794;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_770);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x179);
  local_740 = local_740 & 0xffffffffffffff00;
  local_748 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_738.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_730 = "";
  local_7cc = local_720.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_780._0_1_ = local_7cc == 2;
  local_794 = 2;
  local_778 = (char *)0x0;
  sStack_770.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined4 **)0x1e62cd;
  local_788 = "";
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230a0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = &local_7c0;
  local_7c0 = &local_794;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_770);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x17a);
  local_740 = local_740 & 0xffffffffffffff00;
  local_748 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_738.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_730 = "";
  local_7cc = mb.matrix_.nextIndex_;
  local_780._0_1_ = mb.matrix_.nextIndex_ == 0;
  local_794 = 0;
  local_778 = (char *)0x0;
  sStack_770.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined4 **)0x1e62cd;
  local_788 = "";
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_00223050;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230a0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = &local_7c0;
  local_7c0 = &local_794;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_770);
  Gudhi::persistence_matrix::swap
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
              *)(local_728 + 8),&mb.matrix_);
  auVar2 = local_728;
  local_728 = (undefined1  [8])mb.colSettings_;
  mb.colSettings_ = (Column_settings *)auVar2;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x17e);
  local_740 = local_740 & 0xffffffffffffff00;
  local_748 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_738.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_730 = "";
  local_7cc = local_720.nextIndex_;
  local_780._0_1_ = local_720.nextIndex_ == 0;
  local_794 = 0;
  local_778 = (char *)0x0;
  sStack_770.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined4 **)0x1e62cd;
  local_788 = "";
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_00223050;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230a0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = &local_7c0;
  local_7c0 = &local_794;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_770);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x17f);
  local_740 = local_740 & 0xffffffffffffff00;
  local_748 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_738.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_730 = "";
  local_7cc = mb.matrix_.nextIndex_;
  local_780._0_1_ = mb.matrix_.nextIndex_ == 7;
  local_794 = 7;
  local_778 = (char *)0x0;
  sStack_770.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined4 **)0x1e62cd;
  local_788 = "";
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_00223050;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230a0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = &local_7c0;
  local_7c0 = &local_794;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_770);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x180);
  local_740 = local_740 & 0xffffffffffffff00;
  local_748 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_738.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_730 = "";
  local_7cc = mb.matrix_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_780._0_1_ = local_7cc == 0;
  local_794 = 0;
  local_778 = (char *)0x0;
  sStack_770.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined4 **)0x1e62cd;
  local_788 = "";
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230a0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = &local_7c0;
  local_7c0 = &local_794;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_770);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x181);
  local_740 = local_740 & 0xffffffffffffff00;
  local_748 = (undefined4 ***)&PTR__lazy_ostream_002230e0;
  sStack_738.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_730 = "";
  local_7cc = mb.matrix_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_780 = (char *)CONCAT71(local_780._1_7_,local_7cc == 2);
  local_794 = 2;
  local_778 = (char *)0x0;
  sStack_770.pi_ = (sp_counted_base *)0x0;
  local_790 = (undefined4 **)0x1e62cd;
  local_788 = "";
  local_7c8 = &local_7cc;
  local_7b0 = (char *)((ulong)local_7b0 & 0xffffffffffffff00);
  local_7b8 = (undefined4 ****)&PTR__lazy_ostream_002230a0;
  sStack_7a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_7a0 = &local_7c8;
  local_760 = (char *)((ulong)local_760 & 0xffffffffffffff00);
  local_768 = &PTR__lazy_ostream_002230a0;
  local_758 = &boost::unit_test::lazy_ostream::inst;
  local_750 = &local_7c0;
  local_7c0 = &local_794;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_770);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
             *)local_728);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  ::~Matrix(&mc2);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  ::~Matrix(&mc1);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  ::~Matrix(&mr);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  ::~Matrix(&mb);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&ordered_boundaries);
  return;
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}